

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.h
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildNode::BuildNode(BuildNode *this,StringRef name,NodeType type)

{
  NodeType type_local;
  BuildNode *this_local;
  StringRef name_local;
  
  Node::Node(&this->super_Node,name);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__BuildNode_0044bf28;
  this->type = type;
  this->commandTimestamp = false;
  this->mutated = false;
  basic::StringList::StringList(&this->exclusionPatterns);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector(&this->mustScanAfterPaths);
  return;
}

Assistant:

explicit BuildNode(StringRef name, NodeType type)
      : Node(name), type(type) {}